

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O3

ptr<Member> __thiscall Environment::getMember(Environment *this,Identifier *ident)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  mapped_type *pmVar2;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ptr<Member> pVar4;
  long *local_80;
  long local_78;
  long local_70 [2];
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  Scope local_34;
  
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,*in_RDX,in_RDX[1] + *in_RDX);
  local_60 = (undefined1  [8])&PTR_evaluate_00130bb0;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_80,local_78 + (long)local_80);
  local_38 = false;
  local_34 = Public;
  pmVar2 = std::__detail::
           _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)ident,(key_type *)local_60);
  (this->symbols)._M_h._M_buckets =
       (__buckets_ptr)(pmVar2->super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (pmVar2->super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->symbols)._M_h._M_bucket_count = (size_type)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_60 = (undefined1  [8])&PTR_evaluate_00130bb0;
  _Var3._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
    _Var3._M_pi = extraout_RDX_01;
  }
  pVar4.super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  pVar4.super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Member>)pVar4.super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Member> Environment::getMember(const Identifier &ident) {
    return symbols[ident];
}